

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_AttachLinsol
              (ARKodeMem ark_mem,ARKLinsolInitFn linit,ARKLinsolSetupFn lsetup,
              ARKLinsolSolveFn lsolve,ARKLinsolFreeFn lfree,SUNLinearSolver_Type lsolve_type,
              void *lmem)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_38;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_AttachLinsol",&local_38);
  if (iVar1 == 0) {
    if (local_38->lfree != (ARKLinsolFreeFn)0x0) {
      (*local_38->lfree)(ark_mem);
    }
    local_38->linit = linit;
    local_38->lsetup = lsetup;
    local_38->lsolve = lsolve;
    local_38->lfree = lfree;
    local_38->lmem = lmem;
    local_38->lsolve_type = lsolve_type;
    local_38->nsetups = 0;
    local_38->nstlp = 0;
  }
  return iVar1;
}

Assistant:

int arkStep_AttachLinsol(ARKodeMem ark_mem, ARKLinsolInitFn linit,
                         ARKLinsolSetupFn lsetup, ARKLinsolSolveFn lsolve,
                         ARKLinsolFreeFn lfree,
                         SUNLinearSolver_Type lsolve_type, void* lmem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing system solver */
  if (step_mem->lfree != NULL) { step_mem->lfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->linit       = linit;
  step_mem->lsetup      = lsetup;
  step_mem->lsolve      = lsolve;
  step_mem->lfree       = lfree;
  step_mem->lmem        = lmem;
  step_mem->lsolve_type = lsolve_type;

  /* Reset all linear solver counters */
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return (ARK_SUCCESS);
}